

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O3

OPJ_SIZE_T
opj_stream_read_data
          (opj_stream_private_t *p_stream,OPJ_BYTE *p_buffer,OPJ_SIZE_T p_size,
          opj_event_mgr_t *p_event_mgr)

{
  OPJ_SIZE_T __n;
  OPJ_SIZE_T OVar1;
  OPJ_BYTE *pOVar2;
  ulong __n_00;
  
  __n_00 = p_stream->m_bytes_in_buffer;
  if (__n_00 < p_size) {
    if ((p_stream->m_status & 4) == 0) {
      if (__n_00 == 0) {
        pOVar2 = p_stream->m_stored_data;
        p_stream->m_current_data = pOVar2;
      }
      else {
        memcpy(p_buffer,p_stream->m_current_data,__n_00);
        pOVar2 = p_stream->m_stored_data;
        OVar1 = p_stream->m_bytes_in_buffer;
        p_stream->m_current_data = pOVar2;
        p_buffer = p_buffer + OVar1;
        p_size = p_size - OVar1;
        p_stream->m_byte_offset = p_stream->m_byte_offset + OVar1;
        p_stream->m_bytes_in_buffer = 0;
      }
      do {
        if (p_size < p_stream->m_buffer_size) {
          __n = (*p_stream->m_read_fn)(pOVar2,p_stream->m_buffer_size,p_stream->m_user_data);
          p_stream->m_bytes_in_buffer = __n;
          if (__n == 0xffffffffffffffff) {
LAB_00108fef:
            opj_event_msg(p_event_mgr,4,"Stream reached its end !\n");
            p_stream->m_bytes_in_buffer = 0;
            *(byte *)&p_stream->m_status = (byte)p_stream->m_status | 4;
            goto LAB_00109014;
          }
          if (p_size <= __n) {
            memcpy(p_buffer,p_stream->m_current_data,p_size);
            p_stream->m_current_data = p_stream->m_current_data + p_size;
            p_stream->m_bytes_in_buffer = p_stream->m_bytes_in_buffer - p_size;
            p_stream->m_byte_offset = p_stream->m_byte_offset + p_size;
            return __n_00 + p_size;
          }
          memcpy(p_buffer,p_stream->m_current_data,__n);
          pOVar2 = p_stream->m_stored_data;
          OVar1 = p_stream->m_bytes_in_buffer;
          p_stream->m_current_data = pOVar2;
        }
        else {
          OVar1 = (*p_stream->m_read_fn)(p_buffer,p_size,p_stream->m_user_data);
          p_stream->m_bytes_in_buffer = OVar1;
          if (OVar1 == 0xffffffffffffffff) goto LAB_00108fef;
          if (p_size <= OVar1) {
            p_stream->m_byte_offset = p_stream->m_byte_offset + OVar1;
            p_stream->m_current_data = p_stream->m_stored_data;
            p_stream->m_bytes_in_buffer = 0;
            return OVar1 + __n_00;
          }
          pOVar2 = p_stream->m_stored_data;
          p_stream->m_current_data = pOVar2;
          __n = OVar1;
        }
        p_stream->m_byte_offset = p_stream->m_byte_offset + OVar1;
        __n_00 = __n_00 + __n;
        p_size = p_size - OVar1;
        p_buffer = p_buffer + OVar1;
        p_stream->m_bytes_in_buffer = 0;
      } while( true );
    }
    memcpy(p_buffer,p_stream->m_current_data,__n_00);
    p_stream->m_current_data = p_stream->m_current_data + p_stream->m_bytes_in_buffer;
    p_stream->m_byte_offset = p_stream->m_byte_offset + p_stream->m_bytes_in_buffer;
    p_stream->m_bytes_in_buffer = 0;
LAB_00109014:
    p_size = -(ulong)(__n_00 == 0) | __n_00;
  }
  else {
    memcpy(p_buffer,p_stream->m_current_data,p_size);
    p_stream->m_current_data = p_stream->m_current_data + p_size;
    p_stream->m_bytes_in_buffer = p_stream->m_bytes_in_buffer - p_size;
    p_stream->m_byte_offset = p_stream->m_byte_offset + p_size;
  }
  return p_size;
}

Assistant:

OPJ_SIZE_T opj_stream_read_data(opj_stream_private_t * p_stream,
                                OPJ_BYTE * p_buffer, OPJ_SIZE_T p_size, opj_event_mgr_t * p_event_mgr)
{
    OPJ_SIZE_T l_read_nb_bytes = 0;
    if (p_stream->m_bytes_in_buffer >= p_size) {
        memcpy(p_buffer, p_stream->m_current_data, p_size);
        p_stream->m_current_data += p_size;
        p_stream->m_bytes_in_buffer -= p_size;
        l_read_nb_bytes += p_size;
        p_stream->m_byte_offset += (OPJ_OFF_T)p_size;
        return l_read_nb_bytes;
    }

    /* we are now in the case when the remaining data if not sufficient */
    if (p_stream->m_status & OPJ_STREAM_STATUS_END) {
        l_read_nb_bytes += p_stream->m_bytes_in_buffer;
        memcpy(p_buffer, p_stream->m_current_data, p_stream->m_bytes_in_buffer);
        p_stream->m_current_data += p_stream->m_bytes_in_buffer;
        p_stream->m_byte_offset += (OPJ_OFF_T)p_stream->m_bytes_in_buffer;
        p_stream->m_bytes_in_buffer = 0;
        return l_read_nb_bytes ? l_read_nb_bytes : (OPJ_SIZE_T) - 1;
    }

    /* the flag is not set, we copy data and then do an actual read on the stream */
    if (p_stream->m_bytes_in_buffer) {
        l_read_nb_bytes += p_stream->m_bytes_in_buffer;
        memcpy(p_buffer, p_stream->m_current_data, p_stream->m_bytes_in_buffer);
        p_stream->m_current_data = p_stream->m_stored_data;
        p_buffer += p_stream->m_bytes_in_buffer;
        p_size -= p_stream->m_bytes_in_buffer;
        p_stream->m_byte_offset += (OPJ_OFF_T)p_stream->m_bytes_in_buffer;
        p_stream->m_bytes_in_buffer = 0;
    } else {
        /* case where we are already at the end of the buffer
           so reset the m_current_data to point to the start of the
           stored buffer to get ready to read from disk*/
        p_stream->m_current_data = p_stream->m_stored_data;
    }

    for (;;) {
        /* we should read less than a chunk -> read a chunk */
        if (p_size < p_stream->m_buffer_size) {
            /* we should do an actual read on the media */
            p_stream->m_bytes_in_buffer = p_stream->m_read_fn(p_stream->m_stored_data,
                                          p_stream->m_buffer_size, p_stream->m_user_data);

            if (p_stream->m_bytes_in_buffer == (OPJ_SIZE_T) - 1) {
                /* end of stream */
                opj_event_msg(p_event_mgr, EVT_INFO, "Stream reached its end !\n");

                p_stream->m_bytes_in_buffer = 0;
                p_stream->m_status |= OPJ_STREAM_STATUS_END;
                /* end of stream */
                return l_read_nb_bytes ? l_read_nb_bytes : (OPJ_SIZE_T) - 1;
            } else if (p_stream->m_bytes_in_buffer < p_size) {
                /* not enough data */
                l_read_nb_bytes += p_stream->m_bytes_in_buffer;
                memcpy(p_buffer, p_stream->m_current_data, p_stream->m_bytes_in_buffer);
                p_stream->m_current_data = p_stream->m_stored_data;
                p_buffer += p_stream->m_bytes_in_buffer;
                p_size -= p_stream->m_bytes_in_buffer;
                p_stream->m_byte_offset += (OPJ_OFF_T)p_stream->m_bytes_in_buffer;
                p_stream->m_bytes_in_buffer = 0;
            } else {
                l_read_nb_bytes += p_size;
                memcpy(p_buffer, p_stream->m_current_data, p_size);
                p_stream->m_current_data += p_size;
                p_stream->m_bytes_in_buffer -= p_size;
                p_stream->m_byte_offset += (OPJ_OFF_T)p_size;
                return l_read_nb_bytes;
            }
        } else {
            /* direct read on the dest buffer */
            p_stream->m_bytes_in_buffer = p_stream->m_read_fn(p_buffer, p_size,
                                          p_stream->m_user_data);

            if (p_stream->m_bytes_in_buffer == (OPJ_SIZE_T) - 1) {
                /*  end of stream */
                opj_event_msg(p_event_mgr, EVT_INFO, "Stream reached its end !\n");

                p_stream->m_bytes_in_buffer = 0;
                p_stream->m_status |= OPJ_STREAM_STATUS_END;
                /* end of stream */
                return l_read_nb_bytes ? l_read_nb_bytes : (OPJ_SIZE_T) - 1;
            } else if (p_stream->m_bytes_in_buffer < p_size) {
                /* not enough data */
                l_read_nb_bytes += p_stream->m_bytes_in_buffer;
                p_stream->m_current_data = p_stream->m_stored_data;
                p_buffer += p_stream->m_bytes_in_buffer;
                p_size -= p_stream->m_bytes_in_buffer;
                p_stream->m_byte_offset += (OPJ_OFF_T)p_stream->m_bytes_in_buffer;
                p_stream->m_bytes_in_buffer = 0;
            } else {
                /* we have read the exact size */
                l_read_nb_bytes += p_stream->m_bytes_in_buffer;
                p_stream->m_byte_offset += (OPJ_OFF_T)p_stream->m_bytes_in_buffer;
                p_stream->m_current_data = p_stream->m_stored_data;
                p_stream->m_bytes_in_buffer = 0;
                return l_read_nb_bytes;
            }
        }
    }
}